

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O2

ssize_t nextChar(iovec *curr,iovec *cont,size_t clen,int match)

{
  size_t sVar1;
  ssize_t sVar2;
  size_t *psVar3;
  bool bVar4;
  
  sVar1 = mpt_memchr(curr,1,match);
  if ((long)sVar1 < 0) {
    if ((clen != 0) && (sVar2 = mpt_memchr(cont,clen,match), -1 < sVar2)) {
      return sVar2 + curr->iov_len;
    }
    sVar1 = curr->iov_len;
    psVar3 = &cont->iov_len;
    while (bVar4 = clen != 0, clen = clen - 1, bVar4) {
      sVar1 = sVar1 + *psVar3;
      psVar3 = psVar3 + 2;
    }
  }
  return sVar1;
}

Assistant:

static ssize_t nextChar(const struct iovec *curr, const struct iovec *cont, size_t clen, int match)
{
	ssize_t part;
	
	if ((part = mpt_memchr(curr, 1, match)) >= 0) {
		return part;
	}
	if (clen && (part = mpt_memchr(cont, clen, match)) >= 0) {
		return curr->iov_len + part;
	}
	part = curr->iov_len;
	
	while (clen--)
		part += (cont++)->iov_len;
	
	return part;
}